

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::
     updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecnnzeroes,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resnvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *tmpvec,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **psccurr,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **pscprev,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *q,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eprev1,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *epsilon)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  fpclass_type fVar20;
  undefined8 uVar21;
  int32_t iVar22;
  int iVar23;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  byte bVar24;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.exp = 0;
  local_128.neg = false;
  v = &eprev1->m_backend;
  if ((&local_128 != &eprev2->m_backend) &&
     (v = &eprev2->m_backend, &local_128 != &eprev1->m_backend)) {
    uVar1 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 8);
    local_128.data._M_elems[8] = (uint)uVar1;
    local_128.data._M_elems[9] = (uint)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)(eprev1->m_backend).data._M_elems;
    uVar5 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 2);
    uVar6 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 4);
    uVar7 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 6);
    local_128.data._M_elems[4] = (uint)uVar6;
    local_128.data._M_elems[5] = (uint)((ulong)uVar6 >> 0x20);
    local_128.data._M_elems[6] = (uint)uVar7;
    local_128.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
    local_128.data._M_elems[0] = (uint)uVar1;
    local_128.data._M_elems[1] = (uint)((ulong)uVar1 >> 0x20);
    local_128.data._M_elems[2] = (uint)uVar5;
    local_128.data._M_elems[3] = (uint)((ulong)uVar5 >> 0x20);
    local_128.exp = (eprev1->m_backend).exp;
    local_128.neg = (eprev1->m_backend).neg;
    local_128.fpclass = (eprev1->m_backend).fpclass;
    local_128.prec_elem = (eprev1->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_128,v);
  uVar21 = local_128._48_8_;
  bVar19 = local_128.neg;
  iVar18 = local_128.exp;
  uVar17 = local_128.data._M_elems[9];
  uVar16 = local_128.data._M_elems[8];
  uVar15 = local_128.data._M_elems[7];
  uVar14 = local_128.data._M_elems[6];
  uVar13 = local_128.data._M_elems[5];
  uVar12 = local_128.data._M_elems[4];
  uVar11 = local_128.data._M_elems[3];
  uVar10 = local_128.data._M_elems[2];
  uVar9 = local_128.data._M_elems[1];
  uVar8 = local_128.data._M_elems[0];
  uVar1._4_4_ = local_128.data._M_elems[2];
  uVar1._0_4_ = local_128.data._M_elems[1];
  uVar5._4_4_ = local_128.data._M_elems[4];
  uVar5._0_4_ = local_128.data._M_elems[3];
  uVar6._4_4_ = local_128.data._M_elems[6];
  uVar6._0_4_ = local_128.data._M_elems[5];
  uVar7._4_4_ = local_128.data._M_elems[8];
  uVar7._0_4_ = local_128.data._M_elems[7];
  fVar20 = local_128.fpclass;
  iVar22 = local_128.prec_elem;
  bVar3 = local_128.data._M_elems[0] != 0;
  bVar4 = local_128.fpclass != cpp_dec_float_finite;
  bVar2 = bVar3 || bVar4;
  bVar24 = local_128.neg ^ bVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator-=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_e8.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_e8.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_e8.exp = (epsilon->m_backend).exp;
  local_e8.neg = (epsilon->m_backend).neg;
  local_e8.fpclass = (epsilon->m_backend).fpclass;
  local_e8.prec_elem = (epsilon->m_backend).prec_elem;
  local_128.neg = (bool)bVar24;
  if (bVar19 != bVar2 && (bVar3 || bVar4)) {
    local_128.neg = (bool)(bVar24 ^ 1);
  }
  local_128.data._M_elems[0] = uVar8;
  local_128.data._M_elems[1] = uVar9;
  local_128.data._M_elems[2] = uVar10;
  local_128.data._M_elems[3] = uVar11;
  local_128.data._M_elems[4] = uVar12;
  local_128.data._M_elems[5] = uVar13;
  local_128.data._M_elems[6] = uVar14;
  local_128.data._M_elems[7] = uVar15;
  local_128.data._M_elems[8] = uVar16;
  local_128.data._M_elems[9] = uVar17;
  local_128.exp = iVar18;
  local_128._48_8_ = uVar21;
  if ((local_e8.fpclass == cpp_dec_float_NaN || fVar20 == cpp_dec_float_NaN) ||
     (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_128,&local_e8), 0 < iVar23)) {
    local_68.m_backend.data._M_elems[0] = uVar8;
    local_68.m_backend.data._M_elems[9] = uVar17;
    local_68.m_backend.exp = iVar18;
    local_68.m_backend.fpclass = fVar20;
    local_68.m_backend.prec_elem = iVar22;
    local_68.m_backend.data._M_elems._4_8_ = uVar1;
    local_68.m_backend.data._M_elems._12_8_ = uVar5;
    local_68.m_backend.data._M_elems._20_8_ = uVar6;
    local_68.m_backend.data._M_elems._28_8_ = uVar7;
    local_68.m_backend.neg = (bool)bVar24;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)*pscprev,&local_68);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(*pscprev);
  }
  vec = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,vec);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [16])0x0;
  local_98 = SUB1613((undefined1  [16])0x0,0);
  uStack_8b = 0;
  auStack_88 = SUB1613((undefined1  [16])0x0,3);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_128,&q->m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  *psccurr = *pscprev;
  return;
}

Assistant:

static void updateScaleFinal(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R q,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(q != 0);
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);

   R fac = -(eprev1 * eprev2);

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);
   *pscprev *= 1.0 / q;
   *pscprev += *psccurr;

   psccurr = pscprev;
}